

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTest.cpp
# Opt level: O3

bool __thiscall CaptureCborTest::DoTest(CaptureCborTest *this)

{
  bool bVar1;
  bool bVar2;
  CaptureSummary cs;
  CaptureSummary tcs;
  char *list [1];
  DnsStats capture;
  CaptureSummary local_230;
  CaptureSummary local_210;
  char *local_1f0;
  DnsStats local_1e8;
  
  DnsStats::DnsStats(&local_1e8);
  CaptureSummary::CaptureSummary(&local_230);
  local_1f0 = "cdns/test/data/gold.cbor";
  bVar1 = DnsStats::LoadCborFiles(&local_1e8,1,&local_1f0);
  if (bVar1) {
    bVar1 = DnsStats::ExportToCaptureSummary(&local_1e8,&local_230);
    if (bVar1) {
      CaptureSummary::CaptureSummary(&local_210);
      bVar1 = CaptureSummary::Load(&local_210,"data/capture_gold.csv");
      if (bVar1) {
        CaptureSummary::Sort(&local_230);
        CaptureSummary::Sort(&local_210);
        bVar2 = ithi_test_class::CompareCS(&local_230,&local_210);
        bVar1 = true;
        if (!bVar2) {
          CaptureSummary::Save(&local_230,"gold-cbor-out.csv");
          goto LAB_0017bc18;
        }
      }
      else {
LAB_0017bc18:
        bVar1 = false;
      }
      CaptureSummary::~CaptureSummary(&local_210);
      goto LAB_0017bc28;
    }
  }
  bVar1 = false;
LAB_0017bc28:
  CaptureSummary::~CaptureSummary(&local_230);
  DnsStats::~DnsStats(&local_1e8);
  return bVar1;
}

Assistant:

bool CaptureCborTest::DoTest()
{
    DnsStats capture;
    CaptureSummary cs;
    char const* list[1] = { cbor_input_test };
    bool ret = capture.LoadCborFiles(1, list);

    if (ret)
    {
        ret = capture.ExportToCaptureSummary(&cs);

        if (ret)
        {
            CaptureSummary tcs;

            ret = tcs.Load(cbor_test_output);

            if (ret)
            {
                cs.Sort();
                tcs.Sort();

                ret = ithi_test_class::CompareCS(&cs, &tcs);

                if (!ret)
                {
                    cs.Save(cbor_test_debug);
                }
            }
        }
    }

    return ret;
}